

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O3

sptr __thiscall pstack::Context::getDwarf(Context *this,sptr *object)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  size_t sVar3;
  element_type *peVar4;
  mapped_type *pmVar5;
  void *__pu;
  key_type *in_RDX;
  element_type *peVar6;
  element_type *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  bool bVar8;
  sptr sVar9;
  undefined1 local_21;
  
  peVar6 = object[1].super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 != (element_type *)0x0) {
    p_Var1 = &(object->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount;
    peVar2 = (in_RDX->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar4 = (element_type *)p_Var1;
    do {
      bVar8 = *(element_type **)
               ((long)&(peVar6->dynamic)._M_t._M_impl.super__Rb_tree_header._M_header + 8) < peVar2;
      if (!bVar8) {
        peVar4 = peVar6;
      }
      peVar6 = *(element_type **)(&(peVar6->dynamic)._M_t._M_impl.field_0x0 + (ulong)bVar8 * 8);
    } while (peVar6 != (element_type *)0x0);
    if (peVar4 != (element_type *)p_Var1) {
      _Var7._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&(peVar4->dynamic)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
      if (_Var7._M_pi <= peVar2) {
        dwarfHits = dwarfHits + 1;
        dwarfLookups = dwarfLookups + 1;
        *(_Base_ptr *)&(this->dwarfCache)._M_t._M_impl =
             *(_Base_ptr *)
              ((long)&(peVar4->dynamic)._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
        sVar3 = (peVar4->dynamic)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        *(size_t *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = sVar3;
        if (sVar3 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(sVar3 + 8) = *(int *)(sVar3 + 8) + 1;
          }
        }
        goto LAB_0015555c;
      }
    }
  }
  dwarfLookups = dwarfLookups + 1;
  std::__shared_ptr<pstack::Dwarf::Info,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pstack::Dwarf::Info>,std::shared_ptr<pstack::Elf::Object>&>
            ((__shared_ptr<pstack::Dwarf::Info,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<pstack::Dwarf::Info> *)&local_21,in_RDX);
  pmVar5 = std::
           map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
           ::operator[]((map<std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>,_std::less<std::shared_ptr<pstack::Elf::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pstack::Elf::Object>,_std::shared_ptr<pstack::Dwarf::Info>_>_>_>
                         *)object,in_RDX);
  (pmVar5->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       *(element_type **)&(this->dwarfCache)._M_t._M_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar5->super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header);
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
LAB_0015555c:
  sVar9.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar9.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (sptr)sVar9.super___shared_ptr<pstack::Dwarf::Info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Dwarf::Info::sptr
Context::getDwarf(Elf::Object::sptr object)
{
    auto it = dwarfCache.find(object);
    dwarfLookups++;
    if (it != dwarfCache.end()) {
        dwarfHits++;
        return it->second;
    }
    auto dwarf = std::make_shared<Dwarf::Info>(object);
    dwarfCache[object] = dwarf;
    return dwarf;
}